

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::MapValueRefDataOnlyByteSize
                 (FieldDescriptor *field,MapValueRef *value)

{
  Type TVar1;
  LogMessage *this;
  LogMessage *in_stack_ffffffffffffff38;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff50;
  LogMessage local_98;
  undefined1 local_50 [32];
  MapValueRef *in_stack_ffffffffffffffd0;
  size_t local_8;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  TVar1 = FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffff50);
  switch(TVar1) {
  case TYPE_DOUBLE:
    local_8 = 8;
    break;
  case TYPE_FLOAT:
    local_8 = 4;
    break;
  case TYPE_INT64:
    MapValueRef::GetInt64Value(in_stack_ffffffffffffffd0);
    local_8 = WireFormatLite::Int64Size(0x472882);
    break;
  case TYPE_UINT64:
    MapValueRef::GetUInt64Value(in_stack_ffffffffffffffd0);
    local_8 = WireFormatLite::UInt64Size(0x4728c5);
    break;
  case TYPE_INT32:
    MapValueRef::GetInt32Value(in_stack_ffffffffffffffd0);
    local_8 = WireFormatLite::Int32Size(0);
    break;
  case TYPE_FIXED64:
    local_8 = 8;
    break;
  case TYPE_FIXED32:
    local_8 = 4;
    break;
  case TYPE_BOOL:
    local_8 = 1;
    break;
  case TYPE_STRING:
    MapValueRef::GetStringValue_abi_cxx11_(in_stack_ffffffffffffffd0);
    local_8 = WireFormatLite::StringSize((string *)0x47292a);
    break;
  case TYPE_GROUP:
    LogMessage::LogMessage
              (in_stack_ffffffffffffff50,(LogLevel_conflict)((ulong)local_50 >> 0x20),
               (char *)in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    LogMessage::operator<<(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    LogFinisher::operator=((LogFinisher *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    LogMessage::~LogMessage((LogMessage *)0x47281e);
    local_8 = 0;
    break;
  case TYPE_MESSAGE:
    MapValueRef::GetMessageValue(in_stack_ffffffffffffffd0);
    local_8 = WireFormatLite::MessageSize<google::protobuf::Message>((Message *)0x47298f);
    break;
  case TYPE_BYTES:
    MapValueRef::GetStringValue_abi_cxx11_(in_stack_ffffffffffffffd0);
    local_8 = WireFormatLite::BytesSize((string *)0x47294c);
    break;
  case TYPE_UINT32:
    MapValueRef::GetUInt32Value(in_stack_ffffffffffffffd0);
    local_8 = WireFormatLite::UInt32Size(0);
    break;
  case TYPE_ENUM:
    MapValueRef::GetEnumValue(in_stack_ffffffffffffffd0);
    local_8 = WireFormatLite::EnumSize(0);
    break;
  case TYPE_SFIXED32:
    local_8 = 4;
    break;
  case TYPE_SFIXED64:
    local_8 = 8;
    break;
  case TYPE_SINT32:
    MapValueRef::GetInt32Value(in_stack_ffffffffffffffd0);
    local_8 = WireFormatLite::SInt32Size(0);
    break;
  case MAX_TYPE:
    MapValueRef::GetInt64Value(in_stack_ffffffffffffffd0);
    local_8 = WireFormatLite::SInt64Size(0x472908);
    break;
  default:
    other = &local_98;
    LogMessage::LogMessage
              (in_stack_ffffffffffffff50,level,(char *)in_stack_ffffffffffffff40,
               (int)((ulong)other >> 0x20));
    this = LogMessage::operator<<(in_stack_ffffffffffffff40,(char *)other);
    LogFinisher::operator=((LogFinisher *)this,other);
    LogMessage::~LogMessage((LogMessage *)0x472a61);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t MapValueRefDataOnlyByteSize(const FieldDescriptor* field,
                                          const MapValueRef& value) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_GROUP:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      CASE_TYPE(BYTES, Bytes, String);
      CASE_TYPE(ENUM, Enum, Enum);
      CASE_TYPE(MESSAGE, Message, Message);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(DOUBLE, Double);
      FIXED_CASE_TYPE(FLOAT, Float);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}